

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEventSubscribe.c
# Opt level: O2

int UpnpEventSubscribe_assign(UpnpEventSubscribe *p,UpnpEventSubscribe *q)

{
  int iVar1;
  uint uVar2;
  
  if (p != q) {
    iVar1 = q->m_TimeOut;
    p->m_ErrCode = q->m_ErrCode;
    p->m_TimeOut = iVar1;
    iVar1 = UpnpEventSubscribe_set_SID(p,q->m_SID);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      iVar1 = UpnpEventSubscribe_set_PublisherUrl(p,q->m_PublisherUrl);
      uVar2 = (uint)(iVar1 != 0);
    }
    return uVar2;
  }
  return 1;
}

Assistant:

int UpnpEventSubscribe_assign(
	UpnpEventSubscribe *p, const UpnpEventSubscribe *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpEventSubscribe_set_ErrCode(
				   p, UpnpEventSubscribe_get_ErrCode(q));
		ok = ok && UpnpEventSubscribe_set_TimeOut(
				   p, UpnpEventSubscribe_get_TimeOut(q));
		ok = ok && UpnpEventSubscribe_set_SID(
				   p, UpnpEventSubscribe_get_SID(q));
		ok = ok && UpnpEventSubscribe_set_PublisherUrl(
				   p, UpnpEventSubscribe_get_PublisherUrl(q));
	}

	return ok;
}